

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O0

cl_int clEnqueueWaitForEvents
                 (cl_command_queue command_queue,cl_uint num_events,cl_event *event_list)

{
  bool bVar1;
  cl_icd_dispatch *pcVar2;
  SConfig *pSVar3;
  undefined8 uVar4;
  SConfig *pSVar5;
  cl_event *in_RDX;
  cl_uint in_ESI;
  CLIntercept *in_RDI;
  CLIntercept *in_stack_00000008;
  time_point toolEnd_3;
  time_point toolStart_3;
  cl_int e;
  time_point toolEnd_2;
  time_point toolStart_2;
  time_point toolEnd_1;
  time_point toolStart_1;
  time_point toolEnd;
  time_point toolStart;
  time_point cpuEnd;
  time_point cpuStart;
  string eventWaitListString;
  uint64_t enqueueCounter;
  cl_int retVal;
  CLIntercept *pIntercept;
  CLIntercept *in_stack_fffffffffffffa80;
  allocator *in_stack_fffffffffffffad8;
  CLIntercept *in_stack_fffffffffffffae0;
  CLIntercept *in_stack_fffffffffffffae8;
  cl_event *in_stack_fffffffffffffaf0;
  allocator *paVar6;
  undefined7 in_stack_fffffffffffffaf8;
  undefined1 in_stack_fffffffffffffaff;
  undefined8 in_stack_fffffffffffffb00;
  cl_uint numEvents;
  char *in_stack_fffffffffffffb08;
  CLIntercept *in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  undefined1 includeId;
  SConfig *in_stack_fffffffffffffb20;
  SConfig *in_stack_fffffffffffffb28;
  CLIntercept *in_stack_fffffffffffffb30;
  time_point in_stack_fffffffffffffb38;
  time_point in_stack_fffffffffffffb40;
  time_point in_stack_fffffffffffffb48;
  time_point in_stack_fffffffffffffb50;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  SConfig *in_stack_fffffffffffffb88;
  CLIntercept *in_stack_fffffffffffffb90;
  undefined8 in_stack_fffffffffffffb98;
  cl_uint numObjects;
  CLIntercept *in_stack_fffffffffffffba0;
  undefined8 in_stack_fffffffffffffc90;
  CLIntercept *this;
  cl_int cVar7;
  char *in_stack_fffffffffffffc98;
  CLIntercept *in_stack_fffffffffffffca0;
  SConfig *in_stack_fffffffffffffca8;
  CLIntercept *in_stack_fffffffffffffcb0;
  int local_344;
  undefined8 local_340;
  undefined8 local_338;
  allocator local_329;
  string local_328 [32];
  undefined8 local_308;
  undefined8 local_300;
  allocator local_2f1;
  string local_2f0 [32];
  undefined8 local_2d0;
  undefined8 local_2c8;
  undefined8 local_2c0;
  undefined8 local_2b8;
  allocator local_261;
  string local_260 [32];
  undefined8 local_240;
  cl_int local_234;
  undefined8 local_230;
  undefined8 local_228;
  undefined8 local_220;
  undefined8 local_218;
  undefined8 local_210;
  allocator local_201;
  string local_200 [32];
  undefined8 local_1e0;
  undefined8 local_1d8;
  allocator local_1c9;
  string local_1c8 [32];
  undefined8 local_1a8;
  undefined8 local_1a0;
  size_t *in_stack_fffffffffffffe68;
  undefined8 in_stack_fffffffffffffe70;
  cl_kernel in_stack_fffffffffffffe78;
  uint64_t in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  CLIntercept *in_stack_fffffffffffffe90;
  size_t *in_stack_fffffffffffffea0;
  cl_command_queue in_stack_fffffffffffffea8;
  allocator local_139;
  string local_138 [32];
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  allocator local_e1;
  string local_e0 [32];
  undefined8 local_c0;
  undefined8 local_b8;
  allocator local_a9;
  string local_a8 [32];
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  string local_58 [32];
  char *local_38;
  cl_int local_2c;
  CLIntercept *local_28;
  cl_event *local_20;
  cl_uint local_14;
  CLIntercept *local_10;
  cl_int local_4;
  
  includeId = (undefined1)((ulong)in_stack_fffffffffffffb18 >> 0x38);
  numEvents = (cl_uint)((ulong)in_stack_fffffffffffffb00 >> 0x20);
  cVar7 = (cl_int)((ulong)in_stack_fffffffffffffc90 >> 0x20);
  numObjects = (cl_uint)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  local_20 = in_RDX;
  local_14 = in_ESI;
  local_10 = in_RDI;
  local_28 = GetIntercept();
  if ((local_28 == (CLIntercept *)0x0) ||
     (pcVar2 = CLIntercept::dispatch(local_28),
     pcVar2->clEnqueueWaitForEvents == (cl_api_clEnqueueWaitForEvents)0x0)) {
    local_344 = 0;
    std::_Swallow_assign::operator=((_Swallow_assign *)&std::ignore,&local_344);
    local_4 = -0x24;
  }
  else {
    local_2c = 0;
    local_38 = (char *)CLIntercept::incrementEnqueueCounter(in_stack_fffffffffffffae8);
    pSVar3 = CLIntercept::config(local_28);
    if (((pSVar3->AubCapture & 1U) != 0) &&
       ((bVar1 = CLIntercept::checkAubCaptureEnqueueLimits(local_28,(uint64_t)local_38), bVar1 &&
        (pSVar3 = CLIntercept::config(local_28), (pSVar3->AubCaptureIndividualEnqueues & 1U) == 0)))
       ) {
      in_stack_fffffffffffffa80 = local_10;
      CLIntercept::startAubCapture
                (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
                 in_stack_fffffffffffffe78,(cl_uint)((ulong)in_stack_fffffffffffffe70 >> 0x20),
                 in_stack_fffffffffffffe68,in_stack_fffffffffffffea0,in_stack_fffffffffffffea8);
    }
    pSVar3 = CLIntercept::config(local_28);
    if ((pSVar3->NullEnqueue & 1U) == 0) {
      std::__cxx11::string::string(local_58);
      in_stack_fffffffffffffcb0 = (CLIntercept *)CLIntercept::config(local_28);
      if ((((in_stack_fffffffffffffcb0->m_Mutex).super___mutex_base._M_mutex.__size[3] & 1U) != 0)
         && (local_14 != 0)) {
        std::__cxx11::string::operator+=(local_58,", event_list = ");
        CLIntercept::getObjectListString<_cl_event*>
                  (in_stack_fffffffffffffba0,numObjects,(_cl_event **)in_stack_fffffffffffffb90,
                   (string *)in_stack_fffffffffffffb88);
      }
      in_stack_fffffffffffffca8 = CLIntercept::config(local_28);
      if ((in_stack_fffffffffffffca8->CallLogging & 1U) != 0) {
        this = local_28;
        in_stack_fffffffffffffc98 = local_38;
        in_stack_fffffffffffffca0 = local_10;
        uVar4 = std::__cxx11::string::c_str();
        CLIntercept::callLoggingEnter
                  (this,"clEnqueueWaitForEvents",(uint64_t)in_stack_fffffffffffffc98,(cl_kernel)0x0,
                   "queue = %p%s",in_stack_fffffffffffffca0,uVar4);
        cVar7 = (cl_int)((ulong)this >> 0x20);
      }
      pSVar3 = CLIntercept::config(local_28);
      if ((pSVar3->EventChecking & 1U) != 0) {
        CLIntercept::checkEventList
                  (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,numEvents,
                   (cl_event *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
                   in_stack_fffffffffffffaf0);
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa80);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa80);
      pSVar3 = CLIntercept::config(local_28);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(local_28), (pSVar3->ChromeCallLogging & 1U) != 0)) {
        local_80 = std::chrono::_V2::steady_clock::now();
        local_70 = local_80;
      }
      pcVar2 = CLIntercept::dispatch(local_28);
      local_2c = (*pcVar2->clEnqueueWaitForEvents)((cl_command_queue)local_10,local_14,local_20);
      pSVar3 = CLIntercept::config(local_28);
      if (((pSVar3->HostPerformanceTiming & 1U) != 0) ||
         (pSVar3 = CLIntercept::config(local_28), (pSVar3->ChromeCallLogging & 1U) != 0)) {
        local_88 = std::chrono::_V2::steady_clock::now();
        local_78 = local_88;
        pSVar3 = CLIntercept::config(local_28);
        if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_28,(uint64_t)local_38), bVar1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_a8,"",&local_a9);
          local_b8 = local_70;
          local_c0 = local_78;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffb40.__d.__r,
                     (char *)in_stack_fffffffffffffb38.__d.__r,(string *)in_stack_fffffffffffffb30,
                     in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
          std::__cxx11::string::~string(local_a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_a9);
        }
      }
      pSVar3 = CLIntercept::config(local_28);
      if (((((pSVar3->ErrorLogging & 1U) != 0) ||
           (pSVar3 = CLIntercept::config(local_28), (pSVar3->ErrorAssert & 1U) != 0)) ||
          (pSVar3 = CLIntercept::config(local_28), (pSVar3->NoErrors & 1U) != 0)) && (local_2c != 0)
         ) {
        pSVar3 = CLIntercept::config(local_28);
        if ((pSVar3->ErrorLogging & 1U) != 0) {
          CLIntercept::logError(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,cVar7);
        }
        pSVar3 = CLIntercept::config(local_28);
        if ((pSVar3->ErrorAssert & 1U) != 0) {
          raise(5);
        }
        pSVar3 = CLIntercept::config(local_28);
        if ((pSVar3->NoErrors & 1U) != 0) {
          local_2c = 0;
        }
      }
      pSVar3 = CLIntercept::config(local_28);
      if ((pSVar3->CallLogging & 1U) != 0) {
        CLIntercept::callLoggingExit
                  (in_stack_fffffffffffffb10,in_stack_fffffffffffffb08,numEvents,
                   (cl_event *)CONCAT17(in_stack_fffffffffffffaff,in_stack_fffffffffffffaf8),
                   (cl_sync_point_khr *)in_stack_fffffffffffffaf0);
      }
      pSVar3 = CLIntercept::config(local_28);
      if ((pSVar3->ChromeCallLogging & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_e0,"",&local_e1);
        local_f0 = local_70;
        local_f8 = local_78;
        CLIntercept::chromeCallLoggingExit
                  (in_stack_fffffffffffffb30,&in_stack_fffffffffffffb28->SuppressLogging,
                   (string *)in_stack_fffffffffffffb20,(bool)includeId,
                   (uint64_t)in_stack_fffffffffffffb10,in_stack_fffffffffffffb40,
                   in_stack_fffffffffffffb38);
        std::__cxx11::string::~string(local_e0);
        std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      }
      pSVar3 = CLIntercept::config(local_28);
      if ((((pSVar3->DevicePerformanceTiming & 1U) != 0) ||
          (pSVar3 = CLIntercept::config(local_28), (pSVar3->ITTPerformanceTiming & 1U) != 0)) ||
         ((pSVar3 = CLIntercept::config(local_28), (pSVar3->ChromePerformanceTiming & 1U) != 0 ||
          ((pSVar3 = CLIntercept::config(local_28),
           (pSVar3->DevicePerfCounterEventBasedSampling & 1U) != 0 ||
           (pSVar3 = CLIntercept::config(local_28),
           (pSVar3->DevicePerfCounterTimeBasedSampling & 1U) != 0)))))) {
        std::chrono::
        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffffa80);
        std::chrono::
        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffffa80);
        pSVar3 = CLIntercept::config(local_28);
        if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
           ((pSVar3 = CLIntercept::config(local_28), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
            (pSVar3 = CLIntercept::config(local_28), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
          local_110 = std::chrono::_V2::steady_clock::now();
          local_100 = local_110;
        }
        CLIntercept::checkTimingEvents(in_stack_00000008);
        pSVar3 = CLIntercept::config(local_28);
        if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
           ((pSVar3 = CLIntercept::config(local_28), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
            (in_stack_fffffffffffffb90 = (CLIntercept *)CLIntercept::config(local_28),
            ((in_stack_fffffffffffffb90->m_Mutex).super___mutex_base._M_mutex.__size[0x11] & 1U) !=
            0)))) {
          local_118 = std::chrono::_V2::steady_clock::now();
          local_108 = local_118;
          in_stack_fffffffffffffb88 = CLIntercept::config(local_28);
          if (((in_stack_fffffffffffffb88->HostPerformanceTiming & 1U) != 0) &&
             (in_stack_fffffffffffffb87 =
                   CLIntercept::checkHostPerformanceTimingEnqueueLimits(local_28,(uint64_t)local_38)
             , (bool)in_stack_fffffffffffffb87)) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_138,"",&local_139);
            CLIntercept::updateHostTimingStats
                      ((CLIntercept *)in_stack_fffffffffffffb40.__d.__r,
                       (char *)in_stack_fffffffffffffb38.__d.__r,(string *)in_stack_fffffffffffffb30
                       ,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
            std::__cxx11::string::~string(local_138);
            std::allocator<char>::~allocator((allocator<char> *)&local_139);
          }
          pSVar3 = CLIntercept::config(local_28);
          if ((pSVar3->ChromeCallLogging & 1U) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&stack0xfffffffffffffe90,"",(allocator *)&stack0xfffffffffffffe8f);
            CLIntercept::chromeCallLoggingExit
                      (in_stack_fffffffffffffb30,&in_stack_fffffffffffffb28->SuppressLogging,
                       (string *)in_stack_fffffffffffffb20,(bool)includeId,
                       (uint64_t)in_stack_fffffffffffffb10,in_stack_fffffffffffffb40,
                       in_stack_fffffffffffffb38);
            std::__cxx11::string::~string((string *)&stack0xfffffffffffffe90);
            std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe8f);
          }
        }
      }
      in_stack_fffffffffffffb50.__d.__r = (duration)CLIntercept::config(local_28);
      if (((((SConfig *)in_stack_fffffffffffffb50.__d.__r)->ChromeTraceBufferSize != 0) &&
          (in_stack_fffffffffffffb48.__d.__r = (duration)CLIntercept::config(local_28),
          (((SConfig *)in_stack_fffffffffffffb48.__d.__r)->ChromeTraceBufferingBlockingCallFlush &
          1U) != 0)) &&
         ((in_stack_fffffffffffffb40.__d.__r = (duration)CLIntercept::config(local_28),
          ((((CLIntercept *)in_stack_fffffffffffffb40.__d.__r)->m_Mutex).super___mutex_base._M_mutex
           .__size[0x11] & 1U) != 0 ||
          (in_stack_fffffffffffffb38.__d.__r = (duration)CLIntercept::config(local_28),
          (((SConfig *)in_stack_fffffffffffffb38.__d.__r)->ChromePerformanceTiming & 1U) != 0)))) {
        std::chrono::
        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffffa80);
        std::chrono::
        time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
        ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)in_stack_fffffffffffffa80);
        in_stack_fffffffffffffb30 = (CLIntercept *)CLIntercept::config(local_28);
        if ((((ulong)(in_stack_fffffffffffffb30->m_Dispatch).clCreateContextFromType & 0x100) != 0)
           && ((in_stack_fffffffffffffb28 = CLIntercept::config(local_28),
               (in_stack_fffffffffffffb28->HostPerformanceTiming & 1U) != 0 ||
               (in_stack_fffffffffffffb20 = CLIntercept::config(local_28),
               (in_stack_fffffffffffffb20->ChromeCallLogging & 1U) != 0)))) {
          local_1a0 = std::chrono::_V2::steady_clock::now();
          in_stack_fffffffffffffe70 = local_1a0;
        }
        CLIntercept::flushChromeTraceBuffering((CLIntercept *)0x14c311);
        pSVar3 = CLIntercept::config(local_28);
        if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
           ((in_stack_fffffffffffffb10 = (CLIntercept *)CLIntercept::config(local_28),
            ((ulong)(in_stack_fffffffffffffb10->m_Dispatch).clCreateContextFromType & 1) != 0 ||
            (pSVar5 = CLIntercept::config(local_28), (pSVar5->ChromeCallLogging & 1U) != 0)))) {
          local_1a8 = std::chrono::_V2::steady_clock::now();
          uVar4 = local_1a8;
          pSVar5 = CLIntercept::config(local_28);
          if (((pSVar5->HostPerformanceTiming & 1U) != 0) &&
             (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                                (local_28,(uint64_t)local_38), bVar1)) {
            paVar6 = &local_1c9;
            std::allocator<char>::allocator();
            local_1e0 = uVar4;
            local_1d8 = in_stack_fffffffffffffe70;
            std::__cxx11::string::string(local_1c8,"",paVar6);
            uVar4 = local_1e0;
            in_stack_fffffffffffffe70 = local_1d8;
            CLIntercept::updateHostTimingStats
                      ((CLIntercept *)in_stack_fffffffffffffb40.__d.__r,
                       (char *)in_stack_fffffffffffffb38.__d.__r,(string *)in_stack_fffffffffffffb30
                       ,in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
            std::__cxx11::string::~string(local_1c8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1c9);
          }
          in_stack_fffffffffffffae0 = (CLIntercept *)CLIntercept::config(local_28);
          if (((in_stack_fffffffffffffae0->m_Mutex).super___mutex_base._M_mutex.__size[0x11] & 1U)
              != 0) {
            in_stack_fffffffffffffad8 = &local_201;
            std::allocator<char>::allocator();
            local_218 = uVar4;
            local_210 = in_stack_fffffffffffffe70;
            std::__cxx11::string::string(local_200,"",in_stack_fffffffffffffad8);
            CLIntercept::chromeCallLoggingExit
                      (in_stack_fffffffffffffb30,&in_stack_fffffffffffffb28->SuppressLogging,
                       (string *)in_stack_fffffffffffffb20,SUB81((ulong)pSVar3 >> 0x38,0),
                       (uint64_t)in_stack_fffffffffffffb10,in_stack_fffffffffffffb40,
                       in_stack_fffffffffffffb38);
            std::__cxx11::string::~string(local_200);
            std::allocator<char>::~allocator((allocator<char> *)&local_201);
          }
        }
        includeId = (undefined1)((ulong)pSVar3 >> 0x38);
      }
      std::__cxx11::string::~string(local_58);
    }
    cVar7 = (cl_int)((ulong)in_stack_fffffffffffffc98 >> 0x20);
    pSVar3 = CLIntercept::config(local_28);
    if ((pSVar3->FinishAfterEnqueue & 1U) == 0) {
      pSVar3 = CLIntercept::config(local_28);
      if ((pSVar3->FlushAfterEnqueue & 1U) != 0) {
        pcVar2 = CLIntercept::dispatch(local_28);
        (*pcVar2->clFlush)((cl_command_queue)local_10);
      }
    }
    else {
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa80);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa80);
      pSVar3 = CLIntercept::config(local_28);
      if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar3 = CLIntercept::config(local_28), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_28), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
        local_230 = std::chrono::_V2::steady_clock::now();
        local_220 = local_230;
      }
      CLIntercept::logFlushOrFinishAfterEnqueueStart
                (in_stack_fffffffffffffb90,&in_stack_fffffffffffffb88->SuppressLogging,
                 (char *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
      pcVar2 = CLIntercept::dispatch(local_28);
      local_234 = (*pcVar2->clFinish)((cl_command_queue)local_10);
      CLIntercept::logFlushOrFinishAfterEnqueueEnd
                (in_stack_fffffffffffffcb0,&in_stack_fffffffffffffca8->SuppressLogging,
                 (char *)in_stack_fffffffffffffca0,cVar7);
      pSVar3 = CLIntercept::config(local_28);
      if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar3 = CLIntercept::config(local_28), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_28), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
        local_240 = std::chrono::_V2::steady_clock::now();
        local_228 = local_240;
        pSVar3 = CLIntercept::config(local_28);
        if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_28,(uint64_t)local_38), bVar1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_260,"",&local_261);
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffb40.__d.__r,
                     (char *)in_stack_fffffffffffffb38.__d.__r,(string *)in_stack_fffffffffffffb30,
                     in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
          std::__cxx11::string::~string(local_260);
          std::allocator<char>::~allocator((allocator<char> *)&local_261);
        }
        pSVar3 = CLIntercept::config(local_28);
        if ((pSVar3->ChromeCallLogging & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&stack0xfffffffffffffd68,"",(allocator *)&stack0xfffffffffffffd67);
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffb30,&in_stack_fffffffffffffb28->SuppressLogging,
                     (string *)in_stack_fffffffffffffb20,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffb10,in_stack_fffffffffffffb40,
                     in_stack_fffffffffffffb38);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffffd68);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd67);
        }
      }
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa80);
      std::chrono::
      time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
      ::time_point((time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                    *)in_stack_fffffffffffffa80);
      pSVar3 = CLIntercept::config(local_28);
      if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar3 = CLIntercept::config(local_28), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_28), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
        local_2c8 = std::chrono::_V2::steady_clock::now();
        local_2b8 = local_2c8;
      }
      CLIntercept::checkTimingEvents(in_stack_00000008);
      pSVar3 = CLIntercept::config(local_28);
      if (((pSVar3->ToolOverheadTiming & 1U) != 0) &&
         ((pSVar3 = CLIntercept::config(local_28), (pSVar3->HostPerformanceTiming & 1U) != 0 ||
          (pSVar3 = CLIntercept::config(local_28), (pSVar3->ChromeCallLogging & 1U) != 0)))) {
        local_2d0 = std::chrono::_V2::steady_clock::now();
        local_2c0 = local_2d0;
        pSVar3 = CLIntercept::config(local_28);
        if (((pSVar3->HostPerformanceTiming & 1U) != 0) &&
           (bVar1 = CLIntercept::checkHostPerformanceTimingEnqueueLimits
                              (local_28,(uint64_t)local_38), bVar1)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_2f0,"",&local_2f1);
          local_300 = local_2b8;
          local_308 = local_2c0;
          CLIntercept::updateHostTimingStats
                    ((CLIntercept *)in_stack_fffffffffffffb40.__d.__r,
                     (char *)in_stack_fffffffffffffb38.__d.__r,(string *)in_stack_fffffffffffffb30,
                     in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
          std::__cxx11::string::~string(local_2f0);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
        }
        pSVar3 = CLIntercept::config(local_28);
        if ((pSVar3->ChromeCallLogging & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_328,"",&local_329);
          local_338 = local_2b8;
          local_340 = local_2c0;
          CLIntercept::chromeCallLoggingExit
                    (in_stack_fffffffffffffb30,&in_stack_fffffffffffffb28->SuppressLogging,
                     (string *)in_stack_fffffffffffffb20,(bool)includeId,
                     (uint64_t)in_stack_fffffffffffffb10,in_stack_fffffffffffffb40,
                     in_stack_fffffffffffffb38);
          std::__cxx11::string::~string(local_328);
          std::allocator<char>::~allocator((allocator<char> *)&local_329);
        }
      }
    }
    pSVar3 = CLIntercept::config(local_28);
    if (((pSVar3->AubCapture & 1U) != 0) &&
       ((pSVar3 = CLIntercept::config(local_28), (pSVar3->AubCaptureIndividualEnqueues & 1U) != 0 ||
        (bVar1 = CLIntercept::checkAubCaptureEnqueueLimits(local_28,(uint64_t)local_38), !bVar1))))
    {
      CLIntercept::stopAubCapture
                (in_stack_fffffffffffffae0,(cl_command_queue)in_stack_fffffffffffffad8);
    }
    local_4 = local_2c;
  }
  return local_4;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL CLIRN(clEnqueueWaitForEvents)(
    cl_command_queue command_queue,
    cl_uint num_events,
    const cl_event* event_list )
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->dispatch().clEnqueueWaitForEvents )
    {
        cl_int  retVal = CL_SUCCESS;

        INCREMENT_ENQUEUE_COUNTER();
        CHECK_AUBCAPTURE_START( command_queue );

        if( pIntercept->config().NullEnqueue == false )
        {
            std::string eventWaitListString;
            if( pIntercept->config().CallLogging && num_events )
            {
                eventWaitListString += ", event_list = ";
                pIntercept->getObjectListString(
                    num_events,
                    event_list,
                    eventWaitListString );
            }
            CALL_LOGGING_ENTER( "queue = %p%s",
                command_queue,
                eventWaitListString.c_str() );
            CHECK_EVENT_LIST( num_events, event_list, NULL );
            HOST_PERFORMANCE_TIMING_START();

            retVal = pIntercept->dispatch().clEnqueueWaitForEvents(
                command_queue,
                num_events,
                event_list );

            HOST_PERFORMANCE_TIMING_END();
            CHECK_ERROR( retVal );
            CALL_LOGGING_EXIT( retVal );
            DEVICE_PERFORMANCE_TIMING_CHECK();
            FLUSH_CHROME_TRACE_BUFFERING();
        }

        FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
        CHECK_AUBCAPTURE_STOP( command_queue );

        return retVal;
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}